

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_certificate.cc
# Opt level: O3

bool __thiscall
bssl::ParseSubjectKeyIdentifier(bssl *this,Input extension_value,Input *subject_key_identifier)

{
  bool bVar1;
  Input input;
  Parser extension_value_parser;
  Parser PStack_28;
  
  input.data_.size_ = (size_t)extension_value.data_.data_;
  input.data_.data_ = (uchar *)this;
  der::Parser::Parser(&PStack_28,input);
  bVar1 = der::Parser::ReadTag(&PStack_28,4,(Input *)extension_value.data_.size_);
  if (bVar1) {
    bVar1 = der::Parser::HasMore(&PStack_28);
    bVar1 = !bVar1;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ParseSubjectKeyIdentifier(der::Input extension_value,
                               der::Input *subject_key_identifier) {
  //    SubjectKeyIdentifier ::= KeyIdentifier
  //
  //    KeyIdentifier ::= OCTET STRING
  der::Parser extension_value_parser(extension_value);
  if (!extension_value_parser.ReadTag(CBS_ASN1_OCTETSTRING,
                                      subject_key_identifier)) {
    return false;
  }

  // There shouldn't be any unconsumed data in the extension SEQUENCE.
  if (extension_value_parser.HasMore()) {
    return false;
  }

  return true;
}